

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatStl.h
# Opt level: O0

size_t Corrade::Utility::formatInto<unsigned_int,unsigned_int>
                 (string *buffer,size_t offset,char *format,uint *args,uint *args_1)

{
  size_t sVar1;
  undefined1 local_78 [8];
  BufferFormatter formatters [3];
  uint *args_local_1;
  uint *args_local;
  char *format_local;
  size_t offset_local;
  string *buffer_local;
  
  formatters[2]._value = args_1;
  Implementation::BufferFormatter::BufferFormatter<unsigned_int>((BufferFormatter *)local_78,args);
  Implementation::BufferFormatter::BufferFormatter<unsigned_int>
            ((BufferFormatter *)&formatters[0]._value,(uint *)formatters[2]._value);
  Implementation::BufferFormatter::BufferFormatter((BufferFormatter *)&formatters[1]._value);
  sVar1 = Implementation::formatFormatters(buffer,offset,format,(BufferFormatter *)local_78,2);
  return sVar1;
}

Assistant:

std::size_t formatInto(std::string& buffer, std::size_t offset, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, offset, format, formatters, sizeof...(args));
}